

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O2

void __thiscall KDReports::Test::testWithHeaders(Test *this)

{
  QFont *pQVar1;
  AutoTableElement *pAVar2;
  int iVar3;
  QLatin1String latin1;
  QLatin1String latin1_00;
  AutoTableElement tableElement;
  QArrayDataPointer<char16_t> local_40;
  Report report;
  
  fillModel(this,4,0x14,false);
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  latin1.m_data = "Noto Sans";
  latin1.m_size = 9;
  QString::QString((QString *)&tableElement,latin1);
  QFont::QFont((QFont *)&local_40,(QString *)&tableElement,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&report);
  QFont::~QFont((QFont *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  pQVar1 = (QFont *)KDReports::Report::header(&report,1);
  latin1_00.m_data = "courier";
  latin1_00.m_size = 7;
  QString::QString((QString *)&tableElement,latin1_00);
  QFont::QFont((QFont *)&local_40,(QString *)&tableElement,0x28,-1,false);
  KDReports::Header::setDefaultFont(pQVar1);
  QFont::~QFont((QFont *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tableElement);
  QString::QString((QString *)&local_40,"This is the page header.\nIt\'s big.\nVery\nbig.\nHuge.");
  KDReports::TextElement::TextElement((TextElement *)&tableElement,(QString *)&local_40);
  KDReports::Header::addElement(pQVar1,&tableElement,1);
  KDReports::TextElement::~TextElement((TextElement *)&tableElement);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  KDReports::AutoTableElement::AutoTableElement(&tableElement,(QAbstractItemModel *)&this->m_model);
  KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&tableElement,0));
  KDReports::AbstractTableElement::setPadding(3.0);
  pAVar2 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::MainTable::setAutoTableElement(pAVar2);
  iVar3 = KDReports::Report::numberOfPages();
  QTest::qCompare(iVar3,2,"report.numberOfPages()","2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                  ,0x1c4);
  KDReports::AutoTableElement::~AutoTableElement(&tableElement);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testWithHeaders()
    {
        fillModel(4, 20);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 8));
        // A page header with a huge font
        KDReports::Header &header = report.header(KDReports::FirstPage);
        header.setDefaultFont(QFont(QLatin1String("courier"), 40));
        header.addElement(KDReports::TextElement("This is the page header.\nIt's big.\nVery\nbig.\nHuge."));
        AutoTableElement tableElement(&m_model);
        tableElement.setVerticalHeaderVisible(true);
        tableElement.setPadding(3);
        report.mainTable()->setAutoTableElement(tableElement);
        // report.exportToFile( "testWithHeaders.pdf" ); // for debugging
#ifndef Q_OS_MAC
        QCOMPARE(report.numberOfPages(), 2);
#endif
    }